

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

string * __thiscall
pbrt::RGBToSpectrumTable::ToString_abi_cxx11_
          (string *__return_storage_ptr__,RGBToSpectrumTable *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string id;
  
  id._M_dataplus._M_p = (pointer)&id.field_2;
  id._M_string_length = 0;
  id.field_2._M_local_buf[0] = '\0';
  if ((((sRGB == this) || (DCI_P3 == this)) || (Rec2020 == this)) || (ACES2065_1 == this)) {
    std::__cxx11::string::assign((char *)&id);
  }
  if (id._M_string_length == 0) {
    LogFatal<char_const(&)[12]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color.cpp"
               ,0xc9,"Check failed: %s",(char (*) [12])"!id.empty()");
  }
  StringPrintf<int_const&,std::__cxx11::string&>
            (__return_storage_ptr__,(pbrt *)"[ RGBToSpectrumTable res: %d %s]",(char *)this,
             (int *)&id,in_R8);
  std::__cxx11::string::~string((string *)&id);
  return __return_storage_ptr__;
}

Assistant:

std::string RGBToSpectrumTable::ToString() const {
    std::string id;
    if (this == RGBToSpectrumTable::sRGB)
        id = "(sRGB) ";
    else if (this == RGBToSpectrumTable::DCI_P3)
        id = "(DCI_P3) ";
    else if (this == RGBToSpectrumTable::Rec2020)
        id = "(Rec2020) ";
    else if (this == RGBToSpectrumTable::ACES2065_1)
        id = "(ACES2065_1) ";
    CHECK(!id.empty());

    return StringPrintf("[ RGBToSpectrumTable res: %d %s]", res, id);
}